

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qrhi_p.h
# Opt level: O2

Command * __thiscall
QRhiBackendCommandList<QGles2CommandBuffer::Command,_1024>::get
          (QRhiBackendCommandList<QGles2CommandBuffer::Command,_1024> *this)

{
  Command *__src;
  undefined1 auVar1 [16];
  Command *__dest;
  ulong uVar2;
  int iVar3;
  
  iVar3 = this->p;
  if (iVar3 == this->a) {
    uVar2 = (long)iVar3 + 0x400;
    this->a = (int)uVar2;
    auVar1._8_8_ = 0;
    auVar1._0_8_ = uVar2;
    uVar2 = 0xffffffffffffffff;
    if (SUB168(auVar1 * ZEXT816(0x68),8) == 0) {
      uVar2 = SUB168(auVar1 * ZEXT816(0x68),0);
    }
    __dest = (Command *)operator_new__(uVar2);
    __src = this->v;
    if (__src != (Command *)0x0) {
      memcpy(__dest,__src,(long)iVar3 * 0x68);
      operator_delete__(__src);
      iVar3 = this->p;
    }
    this->v = __dest;
  }
  else {
    __dest = this->v;
  }
  this->p = iVar3 + 1;
  return __dest + iVar3;
}

Assistant:

inline T &get() {
        if (p == a) {
            a += GROW;
            T *nv = new T[a];
            if (v) {
                memcpy(nv, v, p * sizeof(T));
                delete[] v;
            }
            v = nv;
        }
        return v[p++];
    }